

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# changesoplex.hpp
# Opt level: O3

void __thiscall
soplex::SPxSolverBase<double>::changeLhs
          (SPxSolverBase<double> *this,VectorBase<double> *newLhs,bool scale)

{
  ulong uVar1;
  
  this->m_nonbasicValue = 0.0;
  this->m_nonbasicValueUpToDate = false;
  SPxLPBase<double>::changeLhs(&this->super_SPxLPBase<double>,newLhs,scale);
  if (NO_PROBLEM < (this->super_SPxBasisBase<double>).thestatus) {
    if (0 < (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.set.
            thenum) {
      uVar1 = 0;
      do {
        (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
          super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x6b])
                  ((this->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar1],0,this,uVar1 & 0xffffffff);
        uVar1 = uVar1 + 1;
      } while ((long)uVar1 <
               (long)(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                     super_SVSetBase<double>.set.thenum);
    }
    (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x77])(this);
    return;
  }
  return;
}

Assistant:

void SPxSolverBase<R>::changeLhs(const VectorBase<R>& newLhs, bool scale)
{
   // we better recompute the nonbasic value when changing all lhs
   forceRecompNonbasicValue();

   SPxLPBase<R>::changeLhs(newLhs, scale);

   if(SPxBasisBase<R>::status() > SPxBasisBase<R>::NO_PROBLEM)
   {
      for(int i = 0; i < this->nRows(); ++i)
         changeLhsStatus(i, this->lhs(i));

      unInit();
   }
}